

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

RepeatedFieldAccessor * __thiscall
google::protobuf::Reflection::RepeatedFieldAccessor(Reflection *this,FieldDescriptor *field)

{
  byte bVar1;
  CppStringType CVar2;
  int iVar3;
  Nonnull<const_char_*> pcVar4;
  bool bVar5;
  undefined1 *puVar6;
  LogMessage LStack_18;
  
  bVar1 = field->field_0x1;
  bVar5 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar5) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar5,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    if ((field->field_0x1 & 0x20) == 0) {
      RepeatedFieldAccessor();
      goto LAB_002a645d;
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
    case 1:
    case 8:
      field = (FieldDescriptor *)
              &protobuf::(anonymous_namespace)::
               GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>>()::
               singleton;
      break;
    case 2:
      field = (FieldDescriptor *)
              &protobuf::(anonymous_namespace)::
               GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()::
               singleton;
      break;
    case 3:
      field = (FieldDescriptor *)
              &protobuf::(anonymous_namespace)::
               GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()
               ::singleton;
      break;
    case 4:
      field = (FieldDescriptor *)
              &protobuf::(anonymous_namespace)::
               GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()
               ::singleton;
      break;
    case 5:
      field = (FieldDescriptor *)
              &protobuf::(anonymous_namespace)::
               GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()::
               singleton;
      break;
    case 6:
      field = (FieldDescriptor *)
              &protobuf::(anonymous_namespace)::
               GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()::
               singleton;
      break;
    case 7:
      field = (FieldDescriptor *)
              &protobuf::(anonymous_namespace)::
               GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()::
               singleton;
      break;
    case 9:
      CVar2 = FieldDescriptor::cpp_string_type(field);
      if (CVar2 == kView) {
        return (RepeatedFieldAccessor *)
               &protobuf::(anonymous_namespace)::
                GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::
                singleton;
      }
      if (CVar2 == kString) {
        return (RepeatedFieldAccessor *)
               &protobuf::(anonymous_namespace)::
                GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::
                singleton;
      }
      if (CVar2 == kCord) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&LStack_18,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
                   ,0x1e2);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (&LStack_18,(char (*) [34])"Repeated cords are not supported.");
        goto LAB_002a6488;
      }
    default:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
                 ,0x1ef);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&LStack_18,(char (*) [23])"Should not reach here.");
LAB_002a6488:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_18);
    case 10:
      if ((field->type_ != 0xb) || (bVar5 = FieldDescriptor::is_map_message_type(field), !bVar5)) {
        field = (FieldDescriptor *)
                &protobuf::(anonymous_namespace)::
                 GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::
                 singleton;
        if (protobuf::(anonymous_namespace)::
            GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::singleton
            != '\0') {
          return (RepeatedFieldAccessor *)field;
        }
        goto LAB_002a6468;
      }
      field = (FieldDescriptor *)
              &protobuf::(anonymous_namespace)::
               GetSingleton<google::protobuf::internal::MapFieldAccessor>()::singleton;
      if (protobuf::(anonymous_namespace)::
          GetSingleton<google::protobuf::internal::MapFieldAccessor>()::singleton != '\0') {
        return (RepeatedFieldAccessor *)field;
      }
      iVar3 = __cxa_guard_acquire(&protobuf::(anonymous_namespace)::
                                   GetSingleton<google::protobuf::internal::MapFieldAccessor>()::
                                   singleton);
      if (iVar3 == 0) {
        return (RepeatedFieldAccessor *)field;
      }
      puVar6 = &protobuf::(anonymous_namespace)::
                GetSingleton<google::protobuf::internal::MapFieldAccessor>()::singleton;
      goto LAB_002a647f;
    }
  }
  else {
LAB_002a645d:
    RepeatedFieldAccessor();
LAB_002a6468:
    iVar3 = __cxa_guard_acquire(&protobuf::(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()
                                 ::singleton);
    if (iVar3 == 0) {
      return (RepeatedFieldAccessor *)field;
    }
    puVar6 = &protobuf::(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::singleton
    ;
LAB_002a647f:
    __cxa_guard_release(puVar6);
  }
  return (RepeatedFieldAccessor *)field;
}

Assistant:

const internal::RepeatedFieldAccessor* Reflection::RepeatedFieldAccessor(
    const FieldDescriptor* field) const {
  ABSL_CHECK(field->is_repeated());
  switch (field->cpp_type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, type) \
  case FieldDescriptor::CPPTYPE_##TYPE:   \
    return GetSingleton<internal::RepeatedFieldPrimitiveAccessor<type> >();
    HANDLE_PRIMITIVE_TYPE(INT32, int32_t)
    HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t)
    HANDLE_PRIMITIVE_TYPE(INT64, int64_t)
    HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t)
    HANDLE_PRIMITIVE_TYPE(FLOAT, float)
    HANDLE_PRIMITIVE_TYPE(DOUBLE, double)
    HANDLE_PRIMITIVE_TYPE(BOOL, bool)
    HANDLE_PRIMITIVE_TYPE(ENUM, int32_t)
#undef HANDLE_PRIMITIVE_TYPE
    case FieldDescriptor::CPPTYPE_STRING:
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kCord:
          ABSL_LOG(FATAL) << "Repeated cords are not supported.";
        case FieldDescriptor::CppStringType::kView:
        case FieldDescriptor::CppStringType::kString:
          return GetSingleton<internal::RepeatedPtrFieldStringAccessor>();
      }
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (field->is_map()) {
        return GetSingleton<internal::MapFieldAccessor>();
      } else {
        return GetSingleton<internal::RepeatedPtrFieldMessageAccessor>();
      }
  }
  ABSL_LOG(FATAL) << "Should not reach here.";
  return nullptr;
}